

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionStateTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionStateTests::TestClearSessionLog_StateLogIsNull_LogNotCleared::
TestClearSessionLog_StateLogIsNull_LogNotCleared
          (TestClearSessionLog_StateLogIsNull_LogNotCleared *this)

{
  char *suiteName;
  TestClearSessionLog_StateLogIsNull_LogNotCleared *this_local;
  
  suiteName = SuiteSessionStateTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"ClearSessionLog_StateLogIsNull_LogNotCleared",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionStateTestCase.cpp"
             ,0x45);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestClearSessionLog_StateLogIsNull_LogNotCleared_00459cf0;
  return;
}

Assistant:

TEST(ClearSessionLog_StateLogIsNull_LogNotCleared)
  {
    SessionSettings settings;
    TestLog log;
    log.events = 5;

    SessionState state;

    state.clear();

    CHECK_EQUAL(5, log.events);
  }